

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketInitiator.h
# Opt level: O3

void __thiscall FIX::ThreadedSocketInitiator::lock(ThreadedSocketInitiator *this)

{
  int iVar1;
  
  Mutex::lock(&this->m_mutex);
  iVar1 = (this->m_mutex).m_count;
  (this->m_mutex).m_count = iVar1 + -1;
  if (1 < iVar1) {
    return;
  }
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void lock() { Locker l(m_mutex); }